

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_chunks.c
# Opt level: O0

CURLcode httpchunk_readwrite(Curl_easy *data,Curl_chunker *ch,Curl_cwriter *cw_next,char *buf,
                            size_t blen,size_t *pconsumed)

{
  char cVar1;
  byte bVar2;
  CURLofft CVar3;
  CURLcode CVar4;
  char *pcVar5;
  size_t blen_00;
  size_t trlen;
  char *tr;
  size_t piece;
  CURLcode result;
  size_t *pconsumed_local;
  size_t blen_local;
  char *buf_local;
  Curl_cwriter *cw_next_local;
  Curl_chunker *ch_local;
  Curl_easy *data_local;
  
  *pconsumed = 0;
  if (ch->state == CHUNK_DONE) {
    return CURLE_OK;
  }
  if (ch->state == CHUNK_FAILED) {
    return CURLE_RECV_ERROR;
  }
  pconsumed_local = (size_t *)blen;
  blen_local = (size_t)buf;
  if (((*(ulong *)&(data->set).field_0x8ca >> 0x22 & 1) != 0) && ((ch->field_0x42 & 1) == 0)) {
    if (cw_next == (Curl_cwriter *)0x0) {
      piece._4_4_ = Curl_client_write(data,1,buf,blen);
    }
    else {
      piece._4_4_ = Curl_cwriter_write(data,cw_next,1,buf,blen);
    }
    if (piece._4_4_ != CURLE_OK) {
      ch->state = CHUNK_FAILED;
      ch->last_code = CHUNKE_PASSTHRU_ERROR;
      return piece._4_4_;
    }
  }
  do {
    if (pconsumed_local == (size_t *)0x0) {
      return CURLE_OK;
    }
    switch(ch->state) {
    case CHUNK_HEX:
      if ((((*(char *)blen_local < '0') || ('9' < *(char *)blen_local)) &&
          ((*(char *)blen_local < 'a' || ('f' < *(char *)blen_local)))) &&
         ((*(char *)blen_local < 'A' || ('F' < *(char *)blen_local)))) {
        if (ch->hexindex == '\0') {
          Curl_failf(data,"chunk hex-length char not a hex digit: 0x%x",
                     (ulong)(uint)(int)*(char *)blen_local);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }
        ch->hexbuffer[ch->hexindex] = '\0';
        CVar3 = curlx_strtoofft(ch->hexbuffer,(char **)0x0,0x10,&ch->datasize);
        if (CVar3 != CURL_OFFT_OK) {
          Curl_failf(data,"chunk hex-length not valid: \'%s\'",ch->hexbuffer);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }
        ch->state = CHUNK_LF;
      }
      else {
        if (0xf < ch->hexindex) {
          Curl_failf(data,"chunk hex-length longer than %d",0x10);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_TOO_LONG_HEX;
          return CURLE_RECV_ERROR;
        }
        cVar1 = *(char *)blen_local;
        bVar2 = ch->hexindex;
        ch->hexindex = bVar2 + 1;
        ch->hexbuffer[bVar2] = cVar1;
        blen_local = blen_local + 1;
        pconsumed_local = (size_t *)((long)pconsumed_local + -1);
        *pconsumed = *pconsumed + 1;
      }
      break;
    case CHUNK_LF:
      if (*(char *)blen_local == '\n') {
        if (ch->datasize == 0) {
          ch->state = CHUNK_TRAILER;
        }
        else {
          ch->state = CHUNK_DATA;
          if ((((data != (Curl_easy *)0x0) &&
               ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0)) &&
              (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level))
              )) && (0 < Curl_trc_feat_write.log_level)) {
            Curl_trc_write(data,"http_chunked, chunk start of %ld bytes",ch->datasize);
          }
        }
      }
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      *pconsumed = *pconsumed + 1;
      break;
    case CHUNK_DATA:
      tr = (char *)pconsumed_local;
      if (ch->datasize < (long)pconsumed_local) {
        tr = (char *)curlx_sotouz(ch->datasize);
      }
      if (((*(ulong *)&(data->set).field_0x8ca >> 0x22 & 1) == 0) && ((ch->field_0x42 & 1) == 0)) {
        if (cw_next == (Curl_cwriter *)0x0) {
          piece._4_4_ = Curl_client_write(data,1,(char *)blen_local,(size_t)tr);
        }
        else {
          piece._4_4_ = Curl_cwriter_write(data,cw_next,1,(char *)blen_local,(size_t)tr);
        }
        if (piece._4_4_ != CURLE_OK) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_PASSTHRU_ERROR;
          return piece._4_4_;
        }
      }
      *pconsumed = (size_t)(tr + *pconsumed);
      ch->datasize = ch->datasize - (long)tr;
      blen_local = (size_t)(tr + blen_local);
      pconsumed_local = (size_t *)((long)pconsumed_local - (long)tr);
      if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
          && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)))
          ) && (0 < Curl_trc_feat_write.log_level)) {
        Curl_trc_write(data,"http_chunked, write %zu body bytes, %ld bytes in chunk remain",tr,
                       ch->datasize);
      }
      if (ch->datasize == 0) {
        ch->state = CHUNK_POSTLF;
      }
      break;
    case CHUNK_POSTLF:
      if (*(char *)blen_local == '\n') {
        Curl_httpchunk_reset(data,ch,(ch->field_0x42 & 1) != 0);
      }
      else if (*(char *)blen_local != '\r') {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      *pconsumed = *pconsumed + 1;
      break;
    case CHUNK_STOP:
      if (*(char *)blen_local == '\n') {
        *pconsumed = *pconsumed + 1;
        ch->datasize = (long)pconsumed_local + -1;
        ch->state = CHUNK_DONE;
        if (((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
           && ((((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ) && (0 < Curl_trc_feat_write.log_level)))) {
          Curl_trc_write(data,"http_chunk, response complete");
        }
        data_local._4_4_ = CURLE_OK;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        if ((((data != (Curl_easy *)0x0) && ((*(ulong *)&(data->set).field_0x8ca >> 0x1c & 1) != 0))
            && (((data->state).feat == (curl_trc_feat *)0x0 || (0 < ((data->state).feat)->log_level)
                ))) && (0 < Curl_trc_feat_write.log_level)) {
          Curl_trc_write(data,"http_chunk error, expected 0x0a, seeing 0x%ux",
                         (ulong)(uint)(int)*(char *)blen_local);
        }
        data_local._4_4_ = CURLE_RECV_ERROR;
      }
      return data_local._4_4_;
    case CHUNK_TRAILER:
      if ((*(char *)blen_local == '\r') || (*(char *)blen_local == '\n')) {
        pcVar5 = Curl_dyn_ptr(&ch->trailer);
        if (pcVar5 == (char *)0x0) {
          ch->state = CHUNK_TRAILER_POSTCR;
          break;
        }
        CVar4 = Curl_dyn_addn(&ch->trailer,"\r\n",2);
        if (CVar4 != CURLE_OK) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_OUT_OF_MEMORY;
          return CVar4;
        }
        pcVar5 = Curl_dyn_ptr(&ch->trailer);
        blen_00 = Curl_dyn_len(&ch->trailer);
        if ((*(ulong *)&(data->set).field_0x8ca >> 0x22 & 1) == 0) {
          if (cw_next == (Curl_cwriter *)0x0) {
            piece._4_4_ = Curl_client_write(data,0x44,pcVar5,blen_00);
          }
          else {
            piece._4_4_ = Curl_cwriter_write(data,cw_next,0x44,pcVar5,blen_00);
          }
          if (piece._4_4_ != CURLE_OK) {
            ch->state = CHUNK_FAILED;
            ch->last_code = CHUNKE_PASSTHRU_ERROR;
            return piece._4_4_;
          }
        }
        Curl_dyn_reset(&ch->trailer);
        ch->state = CHUNK_TRAILER_CR;
        if (*(char *)blen_local == '\n') break;
      }
      else {
        CVar4 = Curl_dyn_addn(&ch->trailer,(void *)blen_local,1);
        if (CVar4 != CURLE_OK) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_OUT_OF_MEMORY;
          return CVar4;
        }
      }
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      *pconsumed = *pconsumed + 1;
      break;
    case CHUNK_TRAILER_CR:
      if (*(char *)blen_local != '\n') {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      ch->state = CHUNK_TRAILER_POSTCR;
      blen_local = blen_local + 1;
      pconsumed_local = (size_t *)((long)pconsumed_local + -1);
      *pconsumed = *pconsumed + 1;
      break;
    case CHUNK_TRAILER_POSTCR:
      if ((*(char *)blen_local == '\r') || (*(char *)blen_local == '\n')) {
        if (*(char *)blen_local == '\r') {
          blen_local = blen_local + 1;
          pconsumed_local = (size_t *)((long)pconsumed_local + -1);
          *pconsumed = *pconsumed + 1;
        }
        ch->state = CHUNK_STOP;
      }
      else {
        ch->state = CHUNK_TRAILER;
      }
      break;
    case CHUNK_DONE:
      return CURLE_OK;
    case CHUNK_FAILED:
      return CURLE_RECV_ERROR;
    }
  } while( true );
}

Assistant:

static CURLcode httpchunk_readwrite(struct Curl_easy *data,
                                    struct Curl_chunker *ch,
                                    struct Curl_cwriter *cw_next,
                                    const char *buf, size_t blen,
                                    size_t *pconsumed)
{
  CURLcode result = CURLE_OK;
  size_t piece;

  *pconsumed = 0; /* nothing's written yet */
  /* first check terminal states that will not progress anywhere */
  if(ch->state == CHUNK_DONE)
    return CURLE_OK;
  if(ch->state == CHUNK_FAILED)
    return CURLE_RECV_ERROR;

  /* the original data is written to the client, but we go on with the
     chunk read process, to properly calculate the content length */
  if(data->set.http_te_skip && !ch->ignore_body) {
    if(cw_next)
      result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY, buf, blen);
    else
      result = Curl_client_write(data, CLIENTWRITE_BODY, (char *)buf, blen);
    if(result) {
      ch->state = CHUNK_FAILED;
      ch->last_code = CHUNKE_PASSTHRU_ERROR;
      return result;
    }
  }

  while(blen) {
    switch(ch->state) {
    case CHUNK_HEX:
      if(ISXDIGIT(*buf)) {
        if(ch->hexindex >= CHUNK_MAXNUM_LEN) {
          failf(data, "chunk hex-length longer than %d", CHUNK_MAXNUM_LEN);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_TOO_LONG_HEX; /* longer than we support */
          return CURLE_RECV_ERROR;
        }
        ch->hexbuffer[ch->hexindex++] = *buf;
        buf++;
        blen--;
        (*pconsumed)++;
      }
      else {
        if(0 == ch->hexindex) {
          /* This is illegal data, we received junk where we expected
             a hexadecimal digit. */
          failf(data, "chunk hex-length char not a hex digit: 0x%x", *buf);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }

        /* blen and buf are unmodified */
        ch->hexbuffer[ch->hexindex] = 0;
        if(curlx_strtoofft(ch->hexbuffer, NULL, 16, &ch->datasize)) {
          failf(data, "chunk hex-length not valid: '%s'", ch->hexbuffer);
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_ILLEGAL_HEX;
          return CURLE_RECV_ERROR;
        }
        ch->state = CHUNK_LF; /* now wait for the CRLF */
      }
      break;

    case CHUNK_LF:
      /* waiting for the LF after a chunk size */
      if(*buf == 0x0a) {
        /* we are now expecting data to come, unless size was zero! */
        if(0 == ch->datasize) {
          ch->state = CHUNK_TRAILER; /* now check for trailers */
        }
        else {
          ch->state = CHUNK_DATA;
          CURL_TRC_WRITE(data, "http_chunked, chunk start of %"
                         FMT_OFF_T " bytes", ch->datasize);
        }
      }

      buf++;
      blen--;
      (*pconsumed)++;
      break;

    case CHUNK_DATA:
      /* We expect 'datasize' of data. We have 'blen' right now, it can be
         more or less than 'datasize'. Get the smallest piece.
      */
      piece = blen;
      if(ch->datasize < (curl_off_t)blen)
        piece = curlx_sotouz(ch->datasize);

      /* Write the data portion available */
      if(!data->set.http_te_skip && !ch->ignore_body) {
        if(cw_next)
          result = Curl_cwriter_write(data, cw_next, CLIENTWRITE_BODY,
                                      buf, piece);
        else
          result = Curl_client_write(data, CLIENTWRITE_BODY,
                                    (char *)buf, piece);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_PASSTHRU_ERROR;
          return result;
        }
      }

      *pconsumed += piece;
      ch->datasize -= piece; /* decrease amount left to expect */
      buf += piece;    /* move read pointer forward */
      blen -= piece;   /* decrease space left in this round */
      CURL_TRC_WRITE(data, "http_chunked, write %zu body bytes, %"
                     FMT_OFF_T " bytes in chunk remain",
                     piece, ch->datasize);

      if(0 == ch->datasize)
        /* end of data this round, we now expect a trailing CRLF */
        ch->state = CHUNK_POSTLF;
      break;

    case CHUNK_POSTLF:
      if(*buf == 0x0a) {
        /* The last one before we go back to hex state and start all over. */
        Curl_httpchunk_reset(data, ch, ch->ignore_body);
      }
      else if(*buf != 0x0d) {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      buf++;
      blen--;
      (*pconsumed)++;
      break;

    case CHUNK_TRAILER:
      if((*buf == 0x0d) || (*buf == 0x0a)) {
        char *tr = Curl_dyn_ptr(&ch->trailer);
        /* this is the end of a trailer, but if the trailer was zero bytes
           there was no trailer and we move on */

        if(tr) {
          size_t trlen;
          result = Curl_dyn_addn(&ch->trailer, (char *)STRCONST("\x0d\x0a"));
          if(result) {
            ch->state = CHUNK_FAILED;
            ch->last_code = CHUNKE_OUT_OF_MEMORY;
            return result;
          }
          tr = Curl_dyn_ptr(&ch->trailer);
          trlen = Curl_dyn_len(&ch->trailer);
          if(!data->set.http_te_skip) {
            if(cw_next)
              result = Curl_cwriter_write(data, cw_next,
                                          CLIENTWRITE_HEADER|
                                          CLIENTWRITE_TRAILER,
                                          tr, trlen);
            else
              result = Curl_client_write(data,
                                         CLIENTWRITE_HEADER|
                                         CLIENTWRITE_TRAILER,
                                         tr, trlen);
            if(result) {
              ch->state = CHUNK_FAILED;
              ch->last_code = CHUNKE_PASSTHRU_ERROR;
              return result;
            }
          }
          Curl_dyn_reset(&ch->trailer);
          ch->state = CHUNK_TRAILER_CR;
          if(*buf == 0x0a)
            /* already on the LF */
            break;
        }
        else {
          /* no trailer, we are on the final CRLF pair */
          ch->state = CHUNK_TRAILER_POSTCR;
          break; /* do not advance the pointer */
        }
      }
      else {
        result = Curl_dyn_addn(&ch->trailer, buf, 1);
        if(result) {
          ch->state = CHUNK_FAILED;
          ch->last_code = CHUNKE_OUT_OF_MEMORY;
          return result;
        }
      }
      buf++;
      blen--;
      (*pconsumed)++;
      break;

    case CHUNK_TRAILER_CR:
      if(*buf == 0x0a) {
        ch->state = CHUNK_TRAILER_POSTCR;
        buf++;
        blen--;
        (*pconsumed)++;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        return CURLE_RECV_ERROR;
      }
      break;

    case CHUNK_TRAILER_POSTCR:
      /* We enter this state when a CR should arrive so we expect to
         have to first pass a CR before we wait for LF */
      if((*buf != 0x0d) && (*buf != 0x0a)) {
        /* not a CR then it must be another header in the trailer */
        ch->state = CHUNK_TRAILER;
        break;
      }
      if(*buf == 0x0d) {
        /* skip if CR */
        buf++;
        blen--;
        (*pconsumed)++;
      }
      /* now wait for the final LF */
      ch->state = CHUNK_STOP;
      break;

    case CHUNK_STOP:
      if(*buf == 0x0a) {
        blen--;
        (*pconsumed)++;
        /* Record the length of any data left in the end of the buffer
           even if there is no more chunks to read */
        ch->datasize = blen;
        ch->state = CHUNK_DONE;
        CURL_TRC_WRITE(data, "http_chunk, response complete");
        return CURLE_OK;
      }
      else {
        ch->state = CHUNK_FAILED;
        ch->last_code = CHUNKE_BAD_CHUNK;
        CURL_TRC_WRITE(data, "http_chunk error, expected 0x0a, seeing 0x%ux",
                       (unsigned int)*buf);
        return CURLE_RECV_ERROR;
      }
    case CHUNK_DONE:
      return CURLE_OK;

    case CHUNK_FAILED:
      return CURLE_RECV_ERROR;
    }

  }
  return CURLE_OK;
}